

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

Var __thiscall Js::JavascriptString::ToInteger(JavascriptString *this,int radix)

{
  code *pcVar1;
  int nValue;
  LPCOLESTR pOVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int32 iVar6;
  undefined4 *puVar7;
  char16 *pStr;
  LPCOLESTR pStrEnd;
  ScriptContext *pSVar8;
  CharClassifier *this_00;
  JavascriptLibrary *pJVar9;
  JavascriptString *local_188;
  double local_138;
  double result;
  Var result_3;
  undefined1 local_108 [6];
  char16 ch_1;
  BigUInt bi;
  double result_1;
  int32 result_2;
  uint32 beforeValue;
  char16 ch;
  uint32 value;
  char16 *pchMin;
  size_t length;
  LPCOLESTR pOStack_50;
  bool isNegative;
  char16 *pch;
  char16 *pchEnd;
  char16 *pchStart;
  int radix_local;
  JavascriptString *this_local;
  JavascriptString *local_10;
  
  if ((radix != 0) && ((radix < 2 || (0x24 < radix)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xb95,"(radix == 0 || radix >= 2 && radix <= 36)",
                                "\'radix\' is invalid");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pStr = GetString(this);
  pStrEnd = pStr + this->m_charLength;
  pSVar8 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
  this_00 = ScriptContext::GetCharClassifier(pSVar8);
  pOStack_50 = CharClassifier::SkipWhiteSpace(this_00,pStr,pStrEnd);
  bVar3 = false;
  if (pOStack_50 < pStrEnd) {
    if (*pOStack_50 != L'+') {
      if (*pOStack_50 != L'-') goto LAB_0132c606;
      bVar3 = true;
    }
    pOStack_50 = pOStack_50 + 1;
  }
LAB_0132c606:
  if (radix == 0) {
    if ((pOStack_50 < pStrEnd) && (*pOStack_50 != L'0')) {
      pchStart._4_4_ = 10;
    }
    else if (((long)pStrEnd - (long)pOStack_50 >> 1 < 2) ||
            ((pOStack_50[1] != L'x' && (pOStack_50[1] != L'X')))) {
      pchStart._4_4_ = 10;
    }
    else {
      pchStart._4_4_ = 0x10;
      pOStack_50 = pOStack_50 + 2;
    }
  }
  else {
    pchStart._4_4_ = radix;
    if ((((radix == 0x10) && (1 < (long)pStrEnd - (long)pOStack_50 >> 1)) && (*pOStack_50 == L'0'))
       && ((pOStack_50[1] == L'x' || (pOStack_50[1] == L'X')))) {
      pOStack_50 = pOStack_50 + 2;
    }
  }
  pOVar2 = pOStack_50;
  if (0x25 < pchStart._4_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xbc2,
                                "(radix <= (sizeof(*__countof_helper(maxUintStringLengthTable)) + 0))"
                                ,"radix <= _countof(maxUintStringLengthTable)");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (pStrEnd < pOStack_50) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xbc3,"(pchEnd >= pch)","pchEnd >= pch");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if ((ulong)(byte)maxUintStringLengthTable[(int)pchStart._4_4_] <
      (ulong)((long)pStrEnd - (long)pOStack_50 >> 1)) {
    BigUInt::BigUInt((BigUInt *)local_108);
    while (((pOStack_50 < pStrEnd && ((ushort)*pOStack_50 < 0x80)) &&
           ((int)(uint)(ushort)(short)"%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%"
                                      [(ushort)*pOStack_50] < (int)pchStart._4_4_))) {
      bVar4 = BigUInt::FMulAdd((BigUInt *)local_108,pchStart._4_4_,
                               (uint)(ushort)(short)
                                                  "%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%"
                                                  [(ushort)*pOStack_50]);
      if (!bVar4) {
        pSVar8 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
        JavascriptError::ThrowOutOfMemoryError(pSVar8);
      }
      iVar6 = BigUInt::Clu((BigUInt *)local_108);
      if (0x20 < iVar6) {
        if (bVar3) {
          pSVar8 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
          pJVar9 = ScriptContext::GetLibrary(pSVar8);
          local_188 = (JavascriptString *)
                      JavascriptLibraryBase::GetNegativeInfinite
                                (&pJVar9->super_JavascriptLibraryBase);
        }
        else {
          pSVar8 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
          pJVar9 = ScriptContext::GetLibrary(pSVar8);
          local_188 = (JavascriptString *)
                      JavascriptLibraryBase::GetPositiveInfinite
                                (&pJVar9->super_JavascriptLibraryBase);
        }
        this_local = local_188;
        goto LAB_0132cd05;
      }
      pOStack_50 = pOStack_50 + 1;
    }
    if (pOVar2 == pOStack_50) {
      pSVar8 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
      pJVar9 = ScriptContext::GetLibrary(pSVar8);
      this_local = (JavascriptString *)
                   JavascriptLibraryBase::GetNaN(&pJVar9->super_JavascriptLibraryBase);
    }
    else {
      local_138 = BigUInt::GetDbl((BigUInt *)local_108);
      if (bVar3) {
        local_138 = -local_138;
      }
      pSVar8 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
      this_local = (JavascriptString *)JavascriptNumber::ToVarIntCheck(local_138,pSVar8);
    }
LAB_0132cd05:
    BigUInt::~BigUInt((BigUInt *)local_108);
  }
  else {
    beforeValue = 0;
    while (((pOStack_50 < pStrEnd && ((ushort)*pOStack_50 < 0x80)) &&
           ((int)(uint)(ushort)(short)"%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%"
                                      [(ushort)*pOStack_50] < (int)pchStart._4_4_))) {
      uVar5 = beforeValue * pchStart._4_4_ +
              (uint)(ushort)(short)"%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%"
                                   [(ushort)*pOStack_50];
      if (uVar5 < beforeValue) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                    ,0xbd5,"(value >= beforeValue)","uint overflow");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pOStack_50 = pOStack_50 + 1;
      beforeValue = uVar5;
    }
    if (pOVar2 == pOStack_50) {
      pSVar8 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
      pJVar9 = ScriptContext::GetLibrary(pSVar8);
      this_local = (JavascriptString *)
                   JavascriptLibraryBase::GetNaN(&pJVar9->super_JavascriptLibraryBase);
    }
    else if (bVar3) {
      if ((beforeValue < 0x80000000) && (beforeValue != 0)) {
        nValue = -beforeValue;
        pSVar8 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
        bVar3 = TaggedInt::IsOverflow(nValue);
        if (bVar3) {
          local_10 = (JavascriptString *)JavascriptNumber::NewInlined((double)nValue,pSVar8);
        }
        else {
          local_10 = (JavascriptString *)TaggedInt::ToVarUnchecked(nValue);
        }
        this_local = local_10;
      }
      else {
        bi.m_rgluInit._112_8_ = -(double)beforeValue;
        pSVar8 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
        this_local = (JavascriptString *)JavascriptNumber::New(-(double)beforeValue,pSVar8);
      }
    }
    else {
      pSVar8 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
      this_local = (JavascriptString *)JavascriptNumber::ToVar(beforeValue,pSVar8);
    }
  }
  return this_local;
}

Assistant:

Var JavascriptString::ToInteger(int radix)
    {
        AssertMsg(radix == 0 || radix >= 2 && radix <= 36, "'radix' is invalid");
        const char16* pchStart = GetString();
        const char16* pchEnd =  pchStart + m_charLength;
        const char16 *pch = this->GetScriptContext()->GetCharClassifier()->SkipWhiteSpace(pchStart, pchEnd);
        bool isNegative = false;

        if (pch < pchEnd)
        {
            switch (*pch)
            {
            case '-':
                isNegative = true;
                // Fall through.
            case '+':
                pch++;
                break;
            }
        }

        if (0 == radix)
        {
            if (pch < pchEnd && '0' != pch[0])
            {
                radix = 10;
            }
            else if (pchEnd - pch >= 2 && ('x' == pch[1] || 'X' == pch[1]))
            {
                radix = 16;
                pch += 2;
            }
            else
            {
                 // ES5's 'parseInt' does not allow treating a string beginning with a '0' as an octal value. ES3 does not specify a
                 // behavior
                 radix = 10;
            }
        }
        else if (16 == radix)
        {
            if(pchEnd - pch >= 2 && '0' == pch[0] && ('x' == pch[1] || 'X' == pch[1]))
            {
                pch += 2;
            }
        }

        Assert(radix <= _countof(maxUintStringLengthTable));
        Assert(pchEnd >= pch);
        size_t length = pchEnd - pch;
        const char16 *const pchMin = pch;
        __analysis_assume(radix < _countof(maxUintStringLengthTable));
        if(length <= maxUintStringLengthTable[radix])
        {
            // Use uint32 as integer being parsed - much faster than BigInt
            uint32 value = 0;
            for ( ; pch < pchEnd ; pch++)
            {
                char16 ch = *pch;

                if(ch >= _countof(stringToIntegerMap) || (ch = stringToIntegerMap[ch]) >= radix)
                {
                    break;
                }
                uint32 beforeValue = value;
                value = value * radix + ch;
                AssertMsg(value >= beforeValue, "uint overflow");
            }

            if(pchMin == pch)
            {
                return GetScriptContext()->GetLibrary()->GetNaN();
            }

            if(isNegative)
            {
                // negative zero can only be represented by doubles
                if(value <= INT_MAX && value != 0)
                {
                    int32 result = -((int32)value);
                    return JavascriptNumber::ToVar(result, this->GetScriptContext());
                }
                double result = -((double)(value));
                return JavascriptNumber::New(result, this->GetScriptContext());
            }
            return JavascriptNumber::ToVar(value, this->GetScriptContext());
        }

        BigUInt bi;
        for ( ; pch < pchEnd ; pch++)
        {
            char16 ch = *pch;

            if(ch >= _countof(stringToIntegerMap) || (ch = stringToIntegerMap[ch]) >= radix)
            {
                break;
            }
            if (!bi.FMulAdd(radix, ch))
            {
                //Mimic IE8 which threw an OutOfMemory exception in this case.
                JavascriptError::ThrowOutOfMemoryError(GetScriptContext());
            }
            // If we ever have more than 32 ulongs, the result must be infinite.
            if (bi.Clu() > 32)
            {
                Var result = isNegative ?
                    GetScriptContext()->GetLibrary()->GetNegativeInfinite() :
                    GetScriptContext()->GetLibrary()->GetPositiveInfinite();
                return result;
            }
        }

        if (pchMin == pch)
        {
            return GetScriptContext()->GetLibrary()->GetNaN();
        }

        // Convert to a double.
        double result = bi.GetDbl();
        if(isNegative)
        {
            result = -result;
        }

        return Js::JavascriptNumber::ToVarIntCheck(result, GetScriptContext());
    }